

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Algorithm_Base.cpp
# Opt level: O2

void __thiscall
OSTEI_HRR_Algorithm_Base::HRRDoubletLoop_
          (OSTEI_HRR_Algorithm_Base *this,HRRDoubletStepList *hrrlist,DoubletSet *inittargets,
          DoubletSet *solveddoublets,DoubletSet *pruned,RRStepType steptype)

{
  long lVar1;
  size_type sVar2;
  _Rb_tree_node_base *p_Var3;
  DoubletSet newtargets;
  DoubletSet targets;
  HRRDoubletStep hrr;
  _Rb_tree<Doublet,Doublet,std::_Identity<Doublet>,std::less<Doublet>,std::allocator<Doublet>>
  local_160 [8];
  undefined4 local_158 [2];
  undefined8 local_150;
  undefined4 *local_148;
  undefined4 *local_140;
  undefined8 local_138;
  _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
  local_130;
  HRRDoubletStep local_100;
  
  std::
  _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
  ::_Rb_tree(&local_130,&inittargets->_M_t);
  while (local_130._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_158[0] = 0;
    local_150 = 0;
    local_148 = local_158;
    local_138 = 0;
    local_140 = local_148;
    for (p_Var3 = &local_130._M_impl.super__Rb_tree_header._M_header;
        p_Var3 != local_130._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var3)) {
      lVar1 = std::_Rb_tree_decrement(p_Var3);
      sVar2 = std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::count
                        (solveddoublets,(key_type *)(lVar1 + 0x20));
      if (sVar2 == 0) {
        lVar1 = std::_Rb_tree_decrement(p_Var3);
        (*this->_vptr_OSTEI_HRR_Algorithm_Base[2])(&local_100,this,lVar1 + 0x20,(ulong)steptype);
        std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::push_back(hrrlist,&local_100);
        sVar2 = std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::count
                          (solveddoublets,local_100.src._M_elems);
        if (sVar2 == 0) {
          std::
          _Rb_tree<Doublet,Doublet,std::_Identity<Doublet>,std::less<Doublet>,std::allocator<Doublet>>
          ::_M_insert_unique<Doublet_const&>(local_160,local_100.src._M_elems);
        }
        sVar2 = std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::count
                          (solveddoublets,local_100.src._M_elems + 1);
        if (sVar2 == 0) {
          std::
          _Rb_tree<Doublet,Doublet,std::_Identity<Doublet>,std::less<Doublet>,std::allocator<Doublet>>
          ::_M_insert_unique<Doublet_const&>(local_160,local_100.src._M_elems + 1);
        }
        lVar1 = std::_Rb_tree_decrement(p_Var3);
        std::
        _Rb_tree<Doublet,Doublet,std::_Identity<Doublet>,std::less<Doublet>,std::allocator<Doublet>>
        ::_M_insert_unique<Doublet_const&>
                  ((_Rb_tree<Doublet,Doublet,std::_Identity<Doublet>,std::less<Doublet>,std::allocator<Doublet>>
                    *)solveddoublets,(Doublet *)(lVar1 + 0x20));
        HRRDoubletStep::~HRRDoubletStep(&local_100);
      }
    }
    PruneDoublets_((DoubletSet *)local_160,pruned,steptype);
    std::
    _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
    ::operator=(&local_130,
                (_Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
                 *)local_160);
    std::
    _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
    ::~_Rb_tree((_Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
                 *)local_160);
  }
  std::
  _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
  ::~_Rb_tree(&local_130);
  return;
}

Assistant:

void OSTEI_HRR_Algorithm_Base::HRRDoubletLoop_(HRRDoubletStepList & hrrlist,
                                               const DoubletSet & inittargets,
                                               DoubletSet & solveddoublets,
                                               DoubletSet & pruned,
                                               RRStepType steptype)
{
    DoubletSet targets = inittargets;

    while(targets.size())
    {
        DoubletSet newtargets;

        for(auto it = targets.rbegin(); it != targets.rend(); ++it)
        {
            // skip if done alread
            // this can happen with some of the more complex trees
            if(solveddoublets.count(*it) > 0)
                continue;

            HRRDoubletStep hrr = this->DoubletStep_(*it, steptype);
            hrrlist.push_back(hrr);

            if(solveddoublets.count(hrr.src[0]) == 0)
                newtargets.insert(hrr.src[0]);
            if(solveddoublets.count(hrr.src[1]) == 0)
                newtargets.insert(hrr.src[1]);
            
            solveddoublets.insert(*it);
        }

        //cout << "Generated " << newtargets.size() << " new targets\n";

        PruneDoublets_(newtargets, pruned, steptype);

        //cout << "After pruning: " << newtargets.size() << " new targets\n";
        //for(const auto & it : newtargets)
        //    std::cout << "    " << it << "\n";

        targets = newtargets;
    } 

}